

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O0

MovePtr<tcu::TestNode,_de::DefaultDeleter<tcu::TestNode>_> * __thiscall
vkt::shaderexecutor::
GenFuncCaseFactory<vkt::shaderexecutor::Signature<float,_float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
::createCase(MovePtr<tcu::TestNode,_de::DefaultDeleter<tcu::TestNode>_> *__return_storage_ptr__,
            GenFuncCaseFactory<vkt::shaderexecutor::Signature<float,_float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
            *this,CaseContext *ctx)

{
  TestContext *testCtx;
  TestCaseGroup *pTVar1;
  TestNode *pTVar2;
  char *name;
  char *description;
  PrecisionCase *pPVar3;
  DefaultDeleter<tcu::TestNode> local_d2;
  allocator<char> local_d1;
  string local_d0;
  allocator<char> local_a9;
  string local_a8;
  allocator<char> local_81;
  string local_80;
  allocator<char> local_59;
  string local_58;
  TestNode *local_28;
  TestCaseGroup *group;
  CaseContext *ctx_local;
  GenFuncCaseFactory<vkt::shaderexecutor::Signature<float,_float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  *this_local;
  
  group = (TestCaseGroup *)ctx;
  ctx_local = (CaseContext *)this;
  this_local = (GenFuncCaseFactory<vkt::shaderexecutor::Signature<float,_float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
                *)__return_storage_ptr__;
  pTVar2 = (TestNode *)operator_new(0x70);
  testCtx = (TestContext *)(group->super_TestNode).m_name.field_2._M_allocated_capacity;
  name = (char *)std::__cxx11::string::c_str();
  description = (char *)std::__cxx11::string::c_str();
  tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)pTVar2,testCtx,name,description);
  pTVar1 = group;
  local_28 = pTVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"scalar",&local_59);
  pPVar3 = createFuncCase<vkt::shaderexecutor::Signature<float,float,float,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>
                     ((CaseContext *)pTVar1,&local_58,(this->m_funcs).func);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pPVar3);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator(&local_59);
  pTVar1 = group;
  pTVar2 = local_28;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"vec2",&local_81);
  pPVar3 = createFuncCase<vkt::shaderexecutor::Signature<tcu::Vector<float,2>,tcu::Vector<float,2>,tcu::Vector<float,2>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>
                     ((CaseContext *)pTVar1,&local_80,
                      (Func<vkt::shaderexecutor::Signature<tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
                       *)(this->m_funcs).func2);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pPVar3);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator(&local_81);
  pTVar1 = group;
  pTVar2 = local_28;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"vec3",&local_a9);
  pPVar3 = createFuncCase<vkt::shaderexecutor::Signature<tcu::Vector<float,3>,tcu::Vector<float,3>,tcu::Vector<float,3>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>
                     ((CaseContext *)pTVar1,&local_a8,
                      (Func<vkt::shaderexecutor::Signature<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
                       *)(this->m_funcs).func3);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pPVar3);
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator(&local_a9);
  pTVar1 = group;
  pTVar2 = local_28;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,"vec4",&local_d1);
  pPVar3 = createFuncCase<vkt::shaderexecutor::Signature<tcu::Vector<float,4>,tcu::Vector<float,4>,tcu::Vector<float,4>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>
                     ((CaseContext *)pTVar1,&local_d0,
                      (Func<vkt::shaderexecutor::Signature<tcu::Vector<float,_4>,_tcu::Vector<float,_4>,_tcu::Vector<float,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
                       *)(this->m_funcs).func4);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pPVar3);
  std::__cxx11::string::~string((string *)&local_d0);
  std::allocator<char>::~allocator(&local_d1);
  pTVar2 = local_28;
  de::DefaultDeleter<tcu::TestNode>::DefaultDeleter(&local_d2);
  de::details::MovePtr<tcu::TestNode,_de::DefaultDeleter<tcu::TestNode>_>::MovePtr
            (__return_storage_ptr__,pTVar2);
  return __return_storage_ptr__;
}

Assistant:

MovePtr<TestNode>	createCase			(const CaseContext& ctx) const
	{
		TestCaseGroup* group = new TestCaseGroup(ctx.testContext, ctx.name.c_str(), ctx.name.c_str());

		group->addChild(createFuncCase(ctx, "scalar", m_funcs.func));
		group->addChild(createFuncCase(ctx, "vec2", m_funcs.func2));
		group->addChild(createFuncCase(ctx, "vec3", m_funcs.func3));
		group->addChild(createFuncCase(ctx, "vec4", m_funcs.func4));
		return MovePtr<TestNode>(group);
	}